

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
__thiscall cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  char *in_RDX;
  char *local_78;
  allocator<char> local_41;
  string local_40 [40];
  char *input_local;
  cmGeneratorExpression *this_local;
  
  local_78 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_78 = "";
  }
  input_local = input;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,local_78,&local_41);
  Parse(this,(string *)input);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmCompiledGeneratorExpression> cmGeneratorExpression::Parse(
  const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}